

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_init(opj_tcd_t *p_tcd,opj_image_t *p_image,opj_cp_t *p_cp)

{
  opj_tcd_tile_t *poVar1;
  opj_tcd_tilecomp_t *poVar2;
  opj_cp_t *p_cp_local;
  opj_image_t *p_image_local;
  opj_tcd_t *p_tcd_local;
  
  p_tcd->image = p_image;
  p_tcd->cp = p_cp;
  poVar1 = (opj_tcd_tile_t *)opj_calloc(1,0x358);
  p_tcd->tcd_image->tiles = poVar1;
  if (p_tcd->tcd_image->tiles == (opj_tcd_tile_t *)0x0) {
    p_tcd_local._4_4_ = 0;
  }
  else {
    poVar2 = (opj_tcd_tilecomp_t *)opj_calloc((ulong)p_image->numcomps,0x40);
    p_tcd->tcd_image->tiles->comps = poVar2;
    if (p_tcd->tcd_image->tiles->comps == (opj_tcd_tilecomp_t *)0x0) {
      p_tcd_local._4_4_ = 0;
    }
    else {
      p_tcd->tcd_image->tiles->numcomps = p_image->numcomps;
      p_tcd->tp_pos = (p_cp->m_specific_param).m_dec.m_layer;
      p_tcd_local._4_4_ = 1;
    }
  }
  return p_tcd_local._4_4_;
}

Assistant:

OPJ_BOOL opj_tcd_init( opj_tcd_t *p_tcd,
                                           opj_image_t * p_image,
                                           opj_cp_t * p_cp )
{
        p_tcd->image = p_image;
        p_tcd->cp = p_cp;

        p_tcd->tcd_image->tiles = (opj_tcd_tile_t *) opj_calloc(1,sizeof(opj_tcd_tile_t));
        if (! p_tcd->tcd_image->tiles) {
                return OPJ_FALSE;
        }

        p_tcd->tcd_image->tiles->comps = (opj_tcd_tilecomp_t *) opj_calloc(p_image->numcomps,sizeof(opj_tcd_tilecomp_t));
        if (! p_tcd->tcd_image->tiles->comps ) {
                return OPJ_FALSE;
        }

        p_tcd->tcd_image->tiles->numcomps = p_image->numcomps;
        p_tcd->tp_pos = p_cp->m_specific_param.m_enc.m_tp_pos;

        return OPJ_TRUE;
}